

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mips.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
CMipsArchitecture::parseOpcode(CMipsArchitecture *this,Parser *parser)

{
  pointer *__ptr;
  MipsParser mipsParser;
  _func_int **local_408;
  _Alloc_hider local_400;
  MipsParser local_3f8;
  
  MipsParser::MipsParser(&local_3f8);
  MipsParser::parseMacro((MipsParser *)&local_408,(Parser *)&local_3f8);
  if (local_408 == (_func_int **)0x0) {
    MipsParser::parseOpcode((MipsParser *)&local_400,(Parser *)&local_3f8);
    (this->super_Architecture)._vptr_Architecture = (_func_int **)local_400._M_p;
    if (local_408 != (_func_int **)0x0) {
      (**(code **)(*local_408 + 8))();
    }
  }
  else {
    (this->super_Architecture)._vptr_Architecture = local_408;
  }
  MipsParser::~MipsParser(&local_3f8);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> CMipsArchitecture::parseOpcode(Parser& parser)
{
	MipsParser mipsParser;

	std::unique_ptr<CAssemblerCommand> macro = mipsParser.parseMacro(parser);
	if (macro != nullptr)
		return macro;

	return mipsParser.parseOpcode(parser);
}